

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O0

void __thiscall QTipLabel::paintEvent(QTipLabel *this,QPaintEvent *ev)

{
  QStyleOption *in_RSI;
  QStylePainter *in_RDI;
  long in_FS_OFFSET;
  QStylePainter p;
  QStyleOptionFrame opt;
  PrimitiveElement in_stack_ffffffffffffff5c;
  QWidget *in_stack_ffffffffffffff68;
  QWidget *widget;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QWidgetData *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  widget = (QWidget *)&local_78;
  QStylePainter::QStylePainter((QStylePainter *)widget,in_stack_ffffffffffffff68);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x4c071f);
  QStyleOption::initFrom(in_RSI,widget);
  QStylePainter::drawPrimitive(in_RDI,in_stack_ffffffffffffff5c,(QStyleOption *)0x4c0742);
  QPainter::end();
  QLabel::paintEvent((QLabel *)opt.super_QStyleOption.palette._8_8_,
                     (QPaintEvent *)opt.super_QStyleOption.palette.d);
  QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x4c0765);
  QStylePainter::~QStylePainter((QStylePainter *)0x4c076f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTipLabel::paintEvent(QPaintEvent *ev)
{
    QStylePainter p(this);
    QStyleOptionFrame opt;
    opt.initFrom(this);
    p.drawPrimitive(QStyle::PE_PanelTipLabel, opt);
    p.end();

    QLabel::paintEvent(ev);
}